

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_statesavers_doit(_glist *x,_binbuf *b)

{
  int iVar1;
  _glist *local_20;
  t_gobj *g;
  _binbuf *b_local;
  _glist *x_local;
  
  for (local_20 = (_glist *)x->gl_list; local_20 != (_glist *)0x0;
      local_20 = (_glist *)(local_20->gl_obj).te_g.g_next) {
    if ((local_20->gl_obj).te_g.g_pd == savestate_class) {
      savestate_doit((t_savestate *)local_20,b);
    }
    else if (((local_20->gl_obj).te_g.g_pd == canvas_class) &&
            (iVar1 = canvas_isabstraction(local_20), iVar1 == 0)) {
      canvas_statesavers_doit(local_20,b);
    }
  }
  return;
}

Assistant:

void canvas_statesavers_doit(t_glist *x, t_binbuf *b)
{
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
        if (g->g_pd == savestate_class)
            savestate_doit((t_savestate *)g, b);
        else if (g->g_pd == canvas_class && !canvas_isabstraction((t_canvas *)g))
            canvas_statesavers_doit((t_glist *)g, b);
}